

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int adiak_launchdate(void)

{
  undefined1 local_20 [8];
  timeval stime;
  int result;
  
  stime.tv_usec._0_4_ = adksys_starttime((timeval *)local_20);
  if ((int)stime.tv_usec == -1) {
    stime.tv_usec._4_4_ = -1;
  }
  else if ((local_20 == (undefined1  [8])0x0) && (stime.tv_sec == 0)) {
    stime.tv_usec._4_4_ = -1;
  }
  else {
    adiak_namevalue("launchdate",2,"runinfo","%D",local_20);
    stime.tv_usec._4_4_ = 0;
  }
  return stime.tv_usec._4_4_;
}

Assistant:

int adiak_launchdate()
{
   int result;
   struct timeval stime;
   result = adksys_starttime(&stime);
   if (result == -1)
      return -1;
   if (stime.tv_sec == 0 && stime.tv_usec == 0)
      return -1;
   adiak_namevalue("launchdate", adiak_general, "runinfo", "%D", stime.tv_sec);
   return 0;
}